

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O1

LY_ERR lyds_insert(lyd_node **first_sibling,lyd_node **leader,lyd_node *node)

{
  lyd_node *leader_00;
  LY_ERR ret__;
  LY_ERR LVar1;
  LY_ERR LVar2;
  lysc_type_bitenum_item *plVar3;
  LY_ERR ret___1;
  lyd_meta *root_meta;
  rb_node *rbt;
  rb_node *rbn;
  lyd_meta *local_48;
  lysc_type_bitenum_item *local_40;
  rb_node *local_38;
  
  if (node->prev != node) {
    if (node->prev->schema == node->schema) goto LAB_00157290;
    if (node->next != (lyd_node *)0x0) {
      if ((node == (lyd_node *)0x0) ||
         ((leader == (lyd_node **)0x0 || (node->schema == node->next->schema)))) goto LAB_00157290;
      goto LAB_001571a8;
    }
  }
  if ((leader != (lyd_node **)0x0) && (node != (lyd_node *)0x0)) {
LAB_001571a8:
    local_40 = (lysc_type_bitenum_item *)lyds_get_rb_tree(node,&local_48);
    if (local_48 != (lyd_meta *)0x0) {
      if ((local_40 != (lysc_type_bitenum_item *)0x0) &&
         (((rb_node *)local_40->dsc != (rb_node *)0x0 ||
          ((rb_node *)local_40->ref != (rb_node *)0x0)))) {
        __assert_fail("!rbt || (!RBN_LEFT(rbt) && !RBN_RIGHT(rbt))",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                      ,0x4c9,
                      "LY_ERR lyds_insert(struct lyd_node **, struct lyd_node **, struct lyd_node *)"
                     );
      }
      lyd_free_meta_single(local_48);
    }
    leader_00 = *leader;
    plVar3 = (lysc_type_bitenum_item *)lyds_get_rb_tree(leader_00,&local_48);
    local_40 = plVar3;
    if (((local_48 != (lyd_meta *)0x0) ||
        (LVar2 = lyds_create_metadata(leader_00,&local_48), LVar2 == LY_SUCCESS)) &&
       ((plVar3 != (lysc_type_bitenum_item *)0x0 ||
        (LVar2 = lyds_additionally_create_rb_tree
                           (first_sibling,leader,local_48,(rb_node **)&local_40),
        LVar2 == LY_SUCCESS)))) {
      LVar1 = rb_insert(node,(rb_node **)&local_40,&local_38);
      LVar2 = LY_EMEM;
      if (LVar1 == LY_SUCCESS) {
        lyds_link_data_node(first_sibling,leader,node,local_48,local_38);
        (local_48->value).field_2.enum_item = local_40;
        LVar2 = LY_SUCCESS;
      }
    }
    return LVar2;
  }
LAB_00157290:
  __assert_fail("LYD_NODE_IS_ALONE(node) && leader && node",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                ,0x4c4,
                "LY_ERR lyds_insert(struct lyd_node **, struct lyd_node **, struct lyd_node *)");
}

Assistant:

LY_ERR
lyds_insert(struct lyd_node **first_sibling, struct lyd_node **leader, struct lyd_node *node)
{
    LY_ERR ret;
    struct rb_node *rbt, *rbn;
    struct lyd_meta *root_meta;

    /* @p node must not be part of another Red-black tree, only single node can satisfy this condition */
    assert(LYD_NODE_IS_ALONE(node) && leader && node);

    /* Clear the @p node. It may have unnecessary data due to duplication or due to lyds_unlink() calls. */
    rbt = lyds_get_rb_tree(node, &root_meta);
    if (root_meta) {
        assert(!rbt || (!RBN_LEFT(rbt) && !RBN_RIGHT(rbt)));
        /* metadata in @p node will certainly no longer be needed */
        lyd_free_meta_single(root_meta);
    }

    /* get the Red-black tree from the @p leader */
    rbt = lyds_get_rb_tree(*leader, &root_meta);
    if (!root_meta) {
        LY_CHECK_RET(lyds_create_metadata(*leader, &root_meta));
    }
    if (!rbt) {
        /* Due to optimization, the Red-black tree has not been created so far, so it will be
         * created additionally now. It may still not be worth creating a tree and it may be better
         * to insert the node by linear search instead, but that is a case for further optimization.
         */
        ret = lyds_additionally_create_rb_tree(first_sibling, leader, root_meta, &rbt);
        LY_CHECK_RET(ret);
    }

    /* Insert the node to the correct order. */
    ret = rb_insert(node, &rbt, &rbn);
    LY_CHECK_RET(ret);
    lyds_link_data_node(first_sibling, leader, node, root_meta, rbn);

    /* the root of the Red-black tree may changed due to insertion, so update the pointer to the root */
    RBT_SET(root_meta, rbt);

    return LY_SUCCESS;
}